

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O2

int __thiscall deqp::gles31::Functional::FboColorTests::init(FboColorTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format;
  Context *context;
  TestNode *node;
  undefined8 extraout_RAX;
  undefined8 uVar1;
  TestNode *node_00;
  char *name;
  undefined8 extraout_RAX_00;
  long lVar2;
  IVec3 local_3c;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"texcubearray"
             ,"Cube map array texture tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  uVar1 = extraout_RAX;
  for (lVar2 = 0; lVar2 != 0x90; lVar2 = lVar2 + 4) {
    node_00 = (TestNode *)operator_new(0x98);
    context = (this->super_TestCaseGroup).m_context;
    format = *(deUint32 *)((long)init::colorFormats + lVar2);
    name = FboTestUtil::getFormatName(format);
    local_3c.m_data[0] = 0x80;
    local_3c.m_data[1] = 0x80;
    local_3c.m_data[2] = 0xc;
    FboColorTexCubeArrayCase::FboColorTexCubeArrayCase
              ((FboColorTexCubeArrayCase *)node_00,context,name,
               glcts::fixed_sample_locations_values + 1,format,&local_3c);
    tcu::TestNode::addChild(node,node_00);
    uVar1 = extraout_RAX_00;
  }
  return (int)uVar1;
}

Assistant:

void FboColorTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA32I,
		GL_RGBA32UI,
		GL_RGBA16I,
		GL_RGBA16UI,
		GL_RGBA8,
		GL_RGBA8I,
		GL_RGBA8UI,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGB10_A2UI,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG32I,
		GL_RG32UI,
		GL_RG16I,
		GL_RG16UI,
		GL_RG8,
		GL_RG8I,
		GL_RG8UI,

		// R formats
		GL_R32I,
		GL_R32UI,
		GL_R16I,
		GL_R16UI,
		GL_R8,
		GL_R8I,
		GL_R8UI,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F,

		// GL_EXT_color_buffer_half_float
		GL_RGB16F
	};

	// .texcubearray
	{
		tcu::TestCaseGroup* texCubeArrayGroup = new tcu::TestCaseGroup(m_testCtx, "texcubearray", "Cube map array texture tests");
		addChild(texCubeArrayGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			texCubeArrayGroup->addChild(new FboColorTexCubeArrayCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
																	 colorFormats[fmtNdx], IVec3(128, 128, 12)));
	}
}